

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O1

void Dsd_Decompose(Dsd_Manager_t *pDsdMan,DdNode **pbFuncs,int nFuncs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Dsd_Node_t **ppDVar5;
  Dsd_Node_t *pDVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  timespec ts;
  int MaxBlock;
  int nCascades;
  uint local_7c;
  timespec local_78;
  uint local_64;
  uint local_60;
  uint local_5c;
  DdNode **local_58;
  uint local_4c;
  long local_48;
  DdManager *local_40;
  ulong local_38;
  
  local_40 = pDsdMan->dd;
  local_58 = pbFuncs;
  if (pDsdMan->nRootsAlloc < nFuncs) {
    if ((0 < pDsdMan->nRootsAlloc) && (pDsdMan->pRoots != (Dsd_Node_t **)0x0)) {
      free(pDsdMan->pRoots);
      pDsdMan->pRoots = (Dsd_Node_t **)0x0;
    }
    pDsdMan->nRootsAlloc = nFuncs;
    ppDVar5 = (Dsd_Node_t **)malloc((long)nFuncs << 3);
    pDsdMan->pRoots = ppDVar5;
  }
  if (pDsdMan->fVerbose != 0) {
    puts("\nDecomposability statistics for individual outputs:");
  }
  s_nDecBlocks = 0;
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_48 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  uVar12 = 0;
  pDsdMan->nRoots = 0;
  s_nCascades = 0;
  local_7c = 0;
  uVar11 = 0;
  local_64 = nFuncs;
  if (0 < nFuncs) {
    local_38 = (ulong)(uint)nFuncs;
    uVar10 = 0;
    uVar11 = 0;
    local_7c = 0;
    uVar12 = 0;
    do {
      iVar2 = clock_gettime(3,&local_78);
      if (iVar2 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
      }
      pDVar6 = dsdKernelDecompose_rec(pDsdMan,local_58[uVar10]);
      iVar2 = pDsdMan->nRoots;
      pDsdMan->nRoots = iVar2 + 1;
      pDsdMan->pRoots[iVar2] = pDVar6;
      Dsd_TreeNodeGetInfoOne(pDsdMan->pRoots[uVar10],(int *)&local_5c,(int *)&local_60);
      if (s_nCascades < (int)local_5c) {
        s_nCascades = local_5c;
      }
      piVar7 = (int *)((ulong)pDsdMan->pRoots[uVar10] & 0xfffffffffffffffe);
      if (*piVar7 == 5) {
        iVar2 = piVar7[9];
        iVar3 = Extra_bddSuppSize(local_40,*(DdNode **)(piVar7 + 4));
        if (iVar3 != (short)iVar2) goto LAB_0080b169;
      }
      else {
LAB_0080b169:
        local_7c = local_7c + 1;
      }
      bVar1 = (int)local_60 < 3;
      uVar4 = local_60;
      if (pDsdMan->fVerbose != 0) {
        local_4c = local_60;
        printf("#%02d: ",uVar10 & 0xffffffff);
        uVar4 = Cudd_SupportSize(local_40,local_58[uVar10]);
        printf("Ins=%2d. ",(ulong)uVar4);
        uVar4 = Dsd_TreeCountNonTerminalNodesOne(pDsdMan->pRoots[uVar10]);
        printf("Gts=%3d. ",(ulong)uVar4);
        uVar4 = Dsd_TreeCountPrimeNodesOne(pDsdMan->pRoots[uVar10]);
        printf("Pri=%3d. ",(ulong)uVar4);
        printf("Max=%3d. ",(ulong)local_60);
        printf("Reuse=%2d. ",0);
        printf("Csc=%2d. ",(ulong)local_5c);
        iVar2 = clock_gettime(3,&local_78);
        if (iVar2 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        printf("T= %.2f s. ",(double)((float)(lVar9 + lVar8) / 1e+06));
        uVar4 = Cudd_DagSize(local_58[uVar10]);
        printf("Bdd=%2d. ",(ulong)uVar4);
        putchar(10);
        fflush(_stdout);
        uVar4 = local_4c;
      }
      uVar12 = uVar12 + bVar1;
      uVar11 = uVar11 + uVar4;
      uVar10 = uVar10 + 1;
    } while (local_38 != uVar10);
  }
  uVar4 = local_64;
  if (pDsdMan->nRoots == local_64) {
    if (pDsdMan->fVerbose != 0) {
      putchar(10);
      puts("The cumulative decomposability statistics:");
      printf("  Total outputs                             = %5d\n",(ulong)uVar4);
      printf("  Decomposable outputs                      = %5d\n",(ulong)local_7c);
      printf("  Completely decomposable outputs           = %5d\n",(ulong)uVar12);
      printf("  The sum of max gate sizes                 = %5d\n",(ulong)uVar11);
      uVar11 = Cudd_SharingSize(local_58,uVar4);
      printf("  Shared BDD size                           = %5d\n",(ulong)uVar11);
      printf("  Decomposition entries                     = %5d\n",
             (ulong)(uint)pDsdMan->Table->num_entries);
      iVar2 = clock_gettime(3,&local_78);
      if (iVar2 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      printf("  Pure decomposition time                   =  %.2f sec\n",
             (double)((float)(lVar8 + local_48) / 1e+06));
    }
    return;
  }
  __assert_fail("pDsdMan->nRoots == nFuncs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdProc.c"
                ,0xc2,"void Dsd_Decompose(Dsd_Manager_t *, DdNode **, int)");
}

Assistant:

void Dsd_Decompose( Dsd_Manager_t * pDsdMan, DdNode ** pbFuncs, int nFuncs )
{
    DdManager * dd = pDsdMan->dd;
    int i;
    abctime clk;
    Dsd_Node_t * pTemp;
    int SumMaxGateSize = 0;
    int nDecOutputs = 0;
    int nCBFOutputs = 0;
/*
s_Loops1 = 0;
s_Loops2 = 0;
s_Loops3 = 0;
s_Case4Calls = 0;
s_Case4CallsSpecial = 0;
s_Case5 = 0;
s_Loops2Useless = 0;
*/
    // resize the number of roots in the manager
    if ( pDsdMan->nRootsAlloc < nFuncs )
    {
        if ( pDsdMan->nRootsAlloc > 0 )
            ABC_FREE( pDsdMan->pRoots );
        pDsdMan->nRootsAlloc = nFuncs;
        pDsdMan->pRoots = (Dsd_Node_t **) ABC_ALLOC( char, pDsdMan->nRootsAlloc * sizeof(Dsd_Node_t *) );
    }

    if ( pDsdMan->fVerbose )
        printf( "\nDecomposability statistics for individual outputs:\n" );

    // set the counter of decomposition nodes
    s_nDecBlocks = 0;

    // perform decomposition for all outputs
    clk = Abc_Clock();
    pDsdMan->nRoots = 0;
    s_nCascades = 0;
    for ( i = 0; i < nFuncs; i++ )
    {
        int nLiteralsPrev;
        int nDecBlocksPrev;
        int nExorGatesPrev;
        int nReusedBlocksPres;
        int nCascades;
        int MaxBlock;
        int nPrimeBlocks;
        abctime clk;

        clk = Abc_Clock();
        nLiteralsPrev     = s_nLiterals;
        nDecBlocksPrev    = s_nDecBlocks;
        nExorGatesPrev    = s_nExorGates;
        nReusedBlocksPres = s_nReusedBlocks;
        nPrimeBlocks      = s_nPrimeBlocks;

        pDsdMan->pRoots[ pDsdMan->nRoots++ ] = dsdKernelDecompose_rec( pDsdMan, pbFuncs[i] );

        Dsd_TreeNodeGetInfoOne( pDsdMan->pRoots[i], &nCascades, &MaxBlock );
        s_nCascades = ddMax( s_nCascades, nCascades );
        pTemp = Dsd_Regular(pDsdMan->pRoots[i]);
        if ( pTemp->Type != DSD_NODE_PRIME || pTemp->nDecs != Extra_bddSuppSize(dd,pTemp->S) )
            nDecOutputs++;
        if ( MaxBlock < 3 )
            nCBFOutputs++;
        SumMaxGateSize += MaxBlock;

        if ( pDsdMan->fVerbose )
        {
            printf("#%02d: ", i );                              
            printf("Ins=%2d. ", Cudd_SupportSize(dd,pbFuncs[i]) );                  
            printf("Gts=%3d. ", Dsd_TreeCountNonTerminalNodesOne( pDsdMan->pRoots[i] ) ); 
            printf("Pri=%3d. ", Dsd_TreeCountPrimeNodesOne( pDsdMan->pRoots[i] ) ); 
            printf("Max=%3d. ", MaxBlock ); 
            printf("Reuse=%2d. ", s_nReusedBlocks-nReusedBlocksPres ); 
            printf("Csc=%2d. ", nCascades ); 
            printf("T= %.2f s. ", (float)(Abc_Clock()-clk)/(float)(CLOCKS_PER_SEC) ) ;
            printf("Bdd=%2d. ", Cudd_DagSize(pbFuncs[i]) ); 
            printf("\n");
            fflush( stdout );
        }
    }
    assert( pDsdMan->nRoots == nFuncs );

    if ( pDsdMan->fVerbose )
    {
        printf( "\n" );
        printf( "The cumulative decomposability statistics:\n" );
        printf( "  Total outputs                             = %5d\n", nFuncs );
        printf( "  Decomposable outputs                      = %5d\n", nDecOutputs );
        printf( "  Completely decomposable outputs           = %5d\n", nCBFOutputs );
        printf( "  The sum of max gate sizes                 = %5d\n", SumMaxGateSize );
        printf( "  Shared BDD size                           = %5d\n", Cudd_SharingSize( pbFuncs, nFuncs ) );
        printf( "  Decomposition entries                     = %5d\n", st__count( pDsdMan->Table ) );
        printf( "  Pure decomposition time                   =  %.2f sec\n", (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC) );
    }
/*
    printf( "s_Loops1 = %d.\n", s_Loops1 );
    printf( "s_Loops2 = %d.\n", s_Loops2 );
    printf( "s_Loops3 = %d.\n", s_Loops3 );
    printf( "s_Case4Calls = %d.\n", s_Case4Calls );
    printf( "s_Case4CallsSpecial = %d.\n", s_Case4CallsSpecial );
    printf( "s_Case5 = %d.\n", s_Case5 );
    printf( "s_Loops2Useless = %d.\n", s_Loops2Useless );
*/
}